

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * get_next_command_abi_cxx11_(void)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)in_RDI,"quit","");
  if ((((byte)std::getline<char,std::char_traits<char>,std::allocator<char>>
              [*(long *)(std::cin + -0x18)] & 2) == 0) &&
     (__s = (char *)readline("eval> "), __s != (char *)0x0)) {
    add_history(__s);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,__s,__s + sVar2);
    if (local_40._M_string_length != 0) {
      sVar3 = 0;
      do {
        if ((0x20 < (ulong)(byte)local_40._M_dataplus._M_p[sVar3]) ||
           ((0x100000600U >> ((ulong)(byte)local_40._M_dataplus._M_p[sVar3] & 0x3f) & 1) == 0)) {
          if (sVar3 != 0xffffffffffffffff) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (&local_40,0,sVar3);
          }
          break;
        }
        sVar3 = sVar3 + 1;
      } while (local_40._M_string_length != sVar3);
    }
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_last_not_of(&local_40,"\t \n",0xffffffffffffffff,3);
    if (sVar3 != 0xffffffffffffffff) {
      if (local_40._M_string_length <= sVar3) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
      }
      local_40._M_dataplus._M_p[sVar3 + 1] = '\0';
      local_40._M_string_length = sVar3 + 1;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (in_RDI,&local_40);
    free(__s);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (in_RDI,"quit");
  if ((((iVar1 != 0) &&
       (iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(in_RDI,"exit"), iVar1 != 0)) &&
      (iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               compare(in_RDI,"help"), iVar1 != 0)) &&
     (iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(in_RDI,"version"), iVar1 != 0)) {
    return in_RDI;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (in_RDI,"(0)");
  return in_RDI;
}

Assistant:

std::string get_next_command() {
  std::string retval("quit");
  if (!std::cin.eof()) {
    char *input_raw = readline("eval> ");
    if (input_raw != nullptr) {
      add_history(input_raw);

      std::string val(input_raw);
      size_t pos = val.find_first_not_of("\t \n");
      if (pos != std::string::npos) {
        val.erase(0, pos);
      }
      pos = val.find_last_not_of("\t \n");
      if (pos != std::string::npos) {
        val.erase(pos + 1, std::string::npos);
      }

      retval = val;

      ::free(input_raw);
    }
  }
  if (retval == "quit" || retval == "exit" || retval == "help" || retval == "version") {
    retval += "(0)";
  }
  return retval;
}